

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::Value(Value *this,String *value)

{
  char *pcVar1;
  
  (this->comments_).ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        *)0x0;
  initBasic(this,stringValue,true);
  pcVar1 = duplicateAndPrefixStringValue((value->_M_dataplus)._M_p,(uint)value->_M_string_length);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const String& value) {
  initBasic(stringValue, true);
  value_.string_ = duplicateAndPrefixStringValue(
      value.data(), static_cast<unsigned>(value.length()));
}